

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

ZSTD_CCtx * ZSTD_createCCtx_advanced(ZSTD_customMem customMem)

{
  ZSTD_customMem customMem_00;
  ZSTD_CCtx *pZVar1;
  ZSTD_cpuid_t ZVar2;
  ZSTD_allocFunction in_stack_00000008;
  ZSTD_freeFunction in_stack_00000010;
  void *in_stack_00000018;
  
  if (((in_stack_00000010 == (ZSTD_freeFunction)0x0) ==
       (in_stack_00000008 == (ZSTD_allocFunction)0x0)) &&
     (customMem_00.customFree = in_stack_00000010, customMem_00.customAlloc = in_stack_00000008,
     customMem_00.opaque = in_stack_00000018, pZVar1 = (ZSTD_CCtx *)ZSTD_calloc(0x390,customMem_00),
     pZVar1 != (ZSTD_CCtx *)0x0)) {
    (pZVar1->customMem).opaque = in_stack_00000018;
    (pZVar1->customMem).customAlloc = in_stack_00000008;
    (pZVar1->customMem).customFree = in_stack_00000010;
    ZVar2 = ZSTD_cpuid();
    pZVar1->bmi2 = ZVar2.f1c >> 8 & 1;
    if (pZVar1->streamStage != zcss_init) {
      return pZVar1;
    }
    pZVar1->cdict = (ZSTD_CDict *)0x0;
    (pZVar1->requestedParams).fParams.contentSizeFlag = 0;
    (pZVar1->requestedParams).fParams.checksumFlag = 0;
    *(undefined8 *)&(pZVar1->requestedParams).fParams.noDictIDFlag = 0;
    (pZVar1->requestedParams).format = ZSTD_f_zstd1;
    (pZVar1->requestedParams).cParams.windowLog = 0;
    (pZVar1->requestedParams).cParams.chainLog = 0;
    (pZVar1->requestedParams).cParams.hashLog = 0;
    (pZVar1->requestedParams).cParams.searchLog = 0;
    (pZVar1->requestedParams).cParams.searchLength = 0;
    (pZVar1->requestedParams).cParams.targetLength = 0;
    (pZVar1->requestedParams).cParams.strategy = 0;
    (pZVar1->requestedParams).disableLiteralCompression = 0;
    (pZVar1->requestedParams).forceWindow = 0;
    (pZVar1->requestedParams).nbWorkers = 0;
    (pZVar1->requestedParams).jobSize = 0;
    (pZVar1->requestedParams).overlapSizeLog = 0;
    (pZVar1->requestedParams).ldmParams.enableLdm = 0;
    (pZVar1->requestedParams).ldmParams.hashLog = 0;
    (pZVar1->requestedParams).ldmParams.bucketSizeLog = 0;
    (pZVar1->requestedParams).customMem.opaque = (void *)0x0;
    (pZVar1->requestedParams).ldmParams.minMatchLength = 0;
    (pZVar1->requestedParams).ldmParams.hashEveryLog = 0;
    *(undefined8 *)&(pZVar1->requestedParams).ldmParams.windowLog = 0;
    (pZVar1->requestedParams).customMem.customAlloc = (ZSTD_allocFunction)0x0;
    (pZVar1->requestedParams).customMem.customFree = (ZSTD_freeFunction)0x0;
    (pZVar1->requestedParams).compressionLevel = 3;
    (pZVar1->requestedParams).fParams.contentSizeFlag = 1;
    return pZVar1;
  }
  return (ZSTD_CCtx *)0x0;
}

Assistant:

ZSTD_CCtx* ZSTD_createCCtx_advanced(ZSTD_customMem customMem)
{
    ZSTD_STATIC_ASSERT(zcss_init==0);
    ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN==(0ULL - 1));
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;
    {   ZSTD_CCtx* const cctx = (ZSTD_CCtx*)ZSTD_calloc(sizeof(ZSTD_CCtx), customMem);
        if (!cctx) return NULL;
        cctx->customMem = customMem;
        cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
        {   size_t const err = ZSTD_CCtx_resetParameters(cctx);
            assert(!ZSTD_isError(err));
            (void)err;
        }
        return cctx;
    }
}